

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

bool_t NodeHibernate(anynode *AnyNode)

{
  nodecontext *p;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool_t bVar6;
  int iVar7;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xb2b,"bool_t NodeHibernate(anynode *)");
  }
  p = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
  if (p->InCollect == 0) {
    p->InCollect = 1;
    bVar6 = 1;
    bVar1 = false;
    iVar7 = 0;
    do {
      if (bVar1) goto LAB_0011bc6a;
      if ((p->Collect)._Used < 0x10) goto LAB_0011bc5d;
      pcVar5 = (p->Collect)._Begin;
      bVar1 = false;
      iVar3 = 0x7fffffff;
      do {
        iVar2 = (**(code **)pcVar5)(*(undefined8 *)(pcVar5 + 8));
        iVar4 = iVar2;
        if (iVar3 < iVar2) {
          iVar4 = iVar3;
        }
        if (iVar2 <= iVar7) {
          iVar4 = iVar3;
        }
        if (iVar2 == -1) {
          bVar1 = true;
          iVar4 = iVar3;
        }
        pcVar5 = pcVar5 + 0x10;
        iVar3 = iVar4;
      } while (pcVar5 != (p->Collect)._Begin + ((p->Collect)._Used & 0xfffffffffffffff0));
      iVar7 = iVar4;
    } while (iVar4 != 0x7fffffff);
    if (!bVar1) {
LAB_0011bc5d:
      bVar6 = NodeContext_Cleanup(p,0);
    }
LAB_0011bc6a:
    p->InCollect = 0;
  }
  else {
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

bool_t NodeHibernate(anynode* AnyNode)
{
    nodecontext* p = Node_Context(AnyNode);
    bool_t Changed = 0;

    if (!p->InCollect)
    {
        int Level;
        int NextLevel;
        memcollectitem* i;
        p->InCollect = 1;

        for (Level=COLLECT_UNUSED;!Changed;Level=NextLevel)
        {
            NextLevel = INT_MAX;
            for (i=ARRAYBEGIN(p->Collect,memcollectitem);i!=ARRAYEND(p->Collect,memcollectitem);++i)
            {
                int v=i->Func(i->Cookie,Level);
                if (v==COLLECT_FOUND)
                    Changed=1;
                else
                if (NextLevel>v && v>Level)
                    NextLevel=v;
            }
            if (NextLevel==INT_MAX)
                break;
        }

        if (!Changed && NodeContext_Cleanup(p,0))
            Changed = 1;

        p->InCollect = 0;
    }

    return Changed;
}